

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int sam_write1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  size_t sVar1;
  hFILE *fp_00;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong __n;
  ulong uVar5;
  size_t __size;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    iVar2 = bam_write1((fp->fp).bgzf,b);
    return iVar2;
  case text_format:
    break;
  case sam:
    goto switchD_00140c0f_caseD_3;
  default:
    abort();
  case cram:
    iVar2 = cram_put_bam_seq((fp->fp).cram,b);
    return iVar2;
  }
  (fp->format).category = sequence_data;
  (fp->format).format = sam;
switchD_00140c0f_caseD_3:
  iVar2 = sam_format1(h,b,&fp->line);
  if (iVar2 < 0) {
    return -1;
  }
  uVar3 = (fp->line).l + 1;
  if ((fp->line).m <= uVar3) {
    uVar3 = uVar3 >> 1 | uVar3;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    __size = (uVar3 >> 0x10 | uVar3) + 1;
    (fp->line).m = __size;
    pcVar4 = (char *)realloc((fp->line).s,__size);
    if (pcVar4 == (char *)0x0) goto LAB_00140cf2;
    (fp->line).s = pcVar4;
  }
  sVar1 = (fp->line).l;
  (fp->line).l = sVar1 + 1;
  (fp->line).s[sVar1] = '\n';
  (fp->line).s[(fp->line).l] = '\0';
LAB_00140cf2:
  fp_00 = (fp->fp).hfile;
  uVar3 = (fp->line).l;
  pcVar4 = (fp->line).s;
  uVar5 = (long)fp_00->limit - (long)fp_00->begin;
  __n = uVar3;
  if (uVar5 < uVar3) {
    __n = uVar5;
  }
  memcpy(fp_00->begin,pcVar4,__n);
  fp_00->begin = fp_00->begin + __n;
  if (uVar5 < uVar3) {
    __n = hwrite2(fp_00,pcVar4,uVar3,__n);
  }
  sVar1 = (fp->line).l;
  iVar2 = -1;
  if (__n == sVar1) {
    iVar2 = (int)sVar1;
  }
  return iVar2;
}

Assistant:

int sam_write1(htsFile *fp, const bam_hdr_t *h, const bam1_t *b)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        return bam_write1(fp->fp.bgzf, b);

    case cram:
        return cram_put_bam_seq(fp->fp.cram, (bam1_t *)b);

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam:
        if (sam_format1(h, b, &fp->line) < 0) return -1;
        kputc('\n', &fp->line);
        if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
        return fp->line.l;

    default:
        abort();
    }
}